

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::ContentEncoding::ParseCompressionEntry
          (ContentEncoding *this,longlong start,longlong size,IMkvReader *pReader,
          ContentCompression *compression)

{
  longlong lVar1;
  int iVar2;
  long lVar3;
  uchar *puVar4;
  unsigned_long_long uVar5;
  longlong lVar6;
  long lVar7;
  longlong pos;
  longlong size_1;
  undefined8 local_48;
  ContentCompression *local_40;
  longlong id;
  
  lVar7 = size + start;
  local_48 = 0;
  pos = start;
  local_40 = compression;
  do {
    if (lVar7 <= pos) {
      return (ulong)((byte)local_48 & 1) * 2 + -2;
    }
    lVar3 = ParseElementHeader(pReader,&pos,lVar7,&id,&size_1);
    lVar1 = size_1;
    lVar6 = pos;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (id == 0x4254) {
      uVar5 = UnserializeUInt(pReader,pos,size_1);
      if ((long)uVar5 < 0) {
        return -2;
      }
      local_40->algo = uVar5;
      local_48 = CONCAT71((int7)(uVar5 >> 8),1);
    }
    else if (id == 0x4255) {
      if (size_1 < 1) {
        return -2;
      }
      puVar4 = SafeArrayAlloc<unsigned_char>(1,size_1);
      lVar6 = pos;
      if (puVar4 == (uchar *)0x0) {
        return -1;
      }
      iVar2 = (**pReader->_vptr_IMkvReader)(pReader,pos,lVar1,puVar4);
      if (iVar2 != 0) {
        lVar7 = 0;
LAB_0015506d:
        operator_delete__(puVar4);
        return lVar7;
      }
      if (local_40->settings != (uchar *)0x0) {
        lVar7 = -2;
        goto LAB_0015506d;
      }
      local_40->settings = puVar4;
      local_40->settings_len = lVar1;
    }
    pos = lVar6 + lVar1;
    if (lVar7 < pos) {
      return -2;
    }
  } while( true );
}

Assistant:

long ContentEncoding::ParseCompressionEntry(long long start, long long size,
                                            IMkvReader* pReader,
                                            ContentCompression* compression) {
  assert(pReader);
  assert(compression);

  long long pos = start;
  const long long stop = start + size;

  bool valid = false;

  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvContentCompAlgo) {
      long long algo = UnserializeUInt(pReader, pos, size);
      if (algo < 0)
        return E_FILE_FORMAT_INVALID;
      compression->algo = algo;
      valid = true;
    } else if (id == libwebm::kMkvContentCompSettings) {
      if (size <= 0)
        return E_FILE_FORMAT_INVALID;

      const size_t buflen = static_cast<size_t>(size);
      unsigned char* buf = SafeArrayAlloc<unsigned char>(1, buflen);
      if (buf == NULL)
        return -1;

      const int read_status =
          pReader->Read(pos, static_cast<long>(buflen), buf);
      if (read_status) {
        delete[] buf;
        return status;
      }

      // There should be only one settings element per content compression.
      if (compression->settings != NULL) {
        delete[] buf;
        return E_FILE_FORMAT_INVALID;
      }

      compression->settings = buf;
      compression->settings_len = buflen;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  // ContentCompAlgo is mandatory
  if (!valid)
    return E_FILE_FORMAT_INVALID;

  return 0;
}